

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

void __thiscall
duckdb::CopyToFunctionLocalState::~CopyToFunctionLocalState(CopyToFunctionLocalState *this)

{
  _Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LocalFunctionData_*,_false> _Var2;
  _Head_base<0UL,_duckdb::GlobalFunctionData_*,_false> _Var3;
  
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__CopyToFunctionLocalState_0245dbd0;
  ::std::
  unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
  ::~unique_ptr(&(this->part_buffer_append_state).
                 super_unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
               );
  _Var1._M_head_impl =
       (this->part_buffer).
       super_unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::HivePartitionedColumnData_*,_std::default_delete<duckdb::HivePartitionedColumnData>_>
       .super__Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (HivePartitionedColumnData *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_PartitionedColumnData + 8))();
  }
  (this->part_buffer).
  super_unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::HivePartitionedColumnData_*,_std::default_delete<duckdb::HivePartitionedColumnData>_>
  .super__Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false>._M_head_impl =
       (HivePartitionedColumnData *)0x0;
  _Var2._M_head_impl =
       (this->local_state).
       super_unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalFunctionData_*,_std::default_delete<duckdb::LocalFunctionData>_>
       .super__Head_base<0UL,_duckdb::LocalFunctionData_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (LocalFunctionData *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_LocalFunctionData[1])();
  }
  (this->local_state).
  super_unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::LocalFunctionData_*,_std::default_delete<duckdb::LocalFunctionData>_>
  .super__Head_base<0UL,_duckdb::LocalFunctionData_*,_false>._M_head_impl = (LocalFunctionData *)0x0
  ;
  _Var3._M_head_impl =
       (this->global_state).
       super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
       .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (GlobalFunctionData *)0x0) {
    (*(_Var3._M_head_impl)->_vptr_GlobalFunctionData[1])();
  }
  (this->global_state).
  super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
  .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
       (GlobalFunctionData *)0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_0244c6d8;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

explicit CopyToFunctionLocalState(unique_ptr<LocalFunctionData> local_state) : local_state(std::move(local_state)) {
	}